

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

int select_smallest_max_connected_cell(saucy *s,int start,int end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  void *__ptr;
  long lVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  iVar13 = s->n;
  __ptr = calloc((long)iVar13,4);
  piVar4 = (s->left).clen;
  iVar10 = start + -1;
  piVar7 = piVar4 + start;
  do {
    iVar10 = iVar10 + 1;
    iVar12 = *piVar7;
    piVar7 = piVar7 + 1;
  } while (iVar12 == 0);
  iVar12 = -1;
  if (iVar10 < end) {
    piVar7 = s->nextnon;
    iVar9 = -1;
    do {
      iVar1 = piVar4[iVar10];
      if (iVar1 <= iVar13) {
        lVar6 = (long)(s->left).lab[iVar10];
        iVar2 = s->depAdj[lVar6];
        lVar8 = (long)iVar2;
        iVar3 = s->depAdj[lVar6 + 1];
        iVar11 = 0;
        if (iVar2 < iVar3) {
          piVar5 = s->depEdg;
          iVar11 = 0;
          lVar6 = lVar8;
          do {
            if (*(int *)((long)__ptr + (long)piVar5[lVar6] * 4) == 0) {
              iVar11 = iVar11 + 1;
              *(undefined4 *)((long)__ptr + (long)piVar5[lVar6] * 4) = 1;
            }
            lVar6 = lVar6 + 1;
          } while (iVar3 != lVar6);
        }
        if (iVar9 < iVar11 || iVar1 < iVar13) {
          iVar9 = iVar11;
          iVar12 = iVar10;
          iVar13 = iVar1;
        }
        if (iVar2 < iVar3) {
          piVar5 = s->depEdg;
          do {
            *(undefined4 *)((long)__ptr + (long)piVar5[lVar8] * 4) = 0;
            lVar8 = lVar8 + 1;
          } while (iVar3 != lVar8);
        }
      }
      iVar10 = piVar7[iVar10];
    } while (iVar10 < end);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return iVar12;
}

Assistant:

static int
select_smallest_max_connected_cell(struct saucy *s, int start, int end)
{
    int smallest_cell = -1, cell;
    int smallest_cell_size = s->n;
    int max_connections = -1;
    int * connection_list = zeros(s->n);
    
    cell = start;
    while( !s->left.clen[cell] ) cell++;
    while( cell < end ) {       
        if (s->left.clen[cell] <= smallest_cell_size) {
            int i, connections = 0;;
            for (i = s->depAdj[s->left.lab[cell]]; i < s->depAdj[s->left.lab[cell]+1]; i++) {
                if (!connection_list[s->depEdg[i]]) {
                    connections++;
                    connection_list[s->depEdg[i]] = 1;
                }
            }
            if ((s->left.clen[cell] < smallest_cell_size) || (connections > max_connections)) {
                smallest_cell_size = s->left.clen[cell];
                max_connections = connections;
                smallest_cell = cell;
            }
            for (i = s->depAdj[s->left.lab[cell]]; i < s->depAdj[s->left.lab[cell]+1]; i++)
                connection_list[s->depEdg[i]] = 0;
        }
        cell = s->nextnon[cell];
    }
    
    ABC_FREE( connection_list );
    return smallest_cell;
}